

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

Object * resolveExpression(Object *__return_storage_ptr__,Expression *expression,Environment *env)

{
  char cVar1;
  TokenType TVar2;
  uint uVar3;
  Expression *pEVar4;
  Expression *expression_00;
  int iVar5;
  size_t sVar6;
  Instance *pIVar7;
  size_t sVar8;
  ObjectType OVar9;
  LiteralType LVar10;
  ulong uVar11;
  Object *pOVar12;
  ulong uVar13;
  LiteralType LVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  Object *pOVar19;
  bool bVar20;
  bool bVar21;
  anon_union_8_4_50a03f35_for_Literal_2 aVar22;
  double dVar23;
  anon_union_8_4_50a03f35_for_Literal_2 aVar24;
  anon_union_8_4_50a03f35_for_Literal_2 aVar25;
  Literal LVar26;
  Literal LVar27;
  Object a;
  Object local_b0;
  Object local_70;
  
  switch(expression->type) {
  case EXPR_BINARY:
    uVar3 = (expression->field_1).binary.line;
    uVar17 = (ulong)uVar3;
    TVar2 = (expression->field_1).binary.op.type;
    pEVar4 = (expression->field_1).binary.right;
    LVar26 = resolveLiteral((expression->field_1).binary.left,uVar3,env);
    aVar22 = LVar26.field_2;
    pIVar7 = LVar26._0_8_;
    LVar27 = resolveLiteral(pEVar4,uVar3,env);
    aVar25 = LVar27.field_2;
    uVar11 = LVar27._0_8_ >> 0x20;
    if (TVar2 == TOKEN_PLUS && (uVar11 == 2 && (ulong)pIVar7 >> 0x20 == 2)) {
      sVar8 = strlen(aVar22.sVal);
      sVar6 = strlen(aVar25.sVal);
      pcVar18 = (char *)malloc(sVar8 + sVar6 + 1);
      *pcVar18 = '\0';
      strcat(pcVar18,aVar22.sVal);
      strcat(pcVar18,aVar25.sVal);
      __return_storage_ptr__->type = OBJECT_LITERAL;
      (__return_storage_ptr__->field_1).instance = (Instance *)(uVar17 | 0x200000000);
      (__return_storage_ptr__->field_1).routine.name = pcVar18;
      return __return_storage_ptr__;
    }
    if ((((ulong)pIVar7 >> 0x20 & 0xfffffffe) == 0) &&
       (uVar11 == 0 || (LVar27._0_8_ & 0xffffffff00000000) == 0x100000000)) {
      if ((LVar26.type == LIT_INT) && (LVar27.type == LIT_INT)) {
        pcVar18 = (char *)0x0;
        switch(TVar2) {
        case TOKEN_MINUS:
          pcVar18 = aVar22.sVal + -aVar25.iVal;
          break;
        case TOKEN_PLUS:
          pcVar18 = aVar25.sVal + aVar22.sVal;
          break;
        case TOKEN_SLASH:
          pcVar18 = (char *)(aVar22.iVal / aVar25.iVal);
          break;
        case TOKEN_STAR:
          pcVar18 = (char *)(aVar25.iVal * aVar22.iVal);
          break;
        case TOKEN_PERCEN:
          pcVar18 = (char *)(aVar22.iVal % aVar25.iVal);
          break;
        case TOKEN_CARET:
          dVar23 = pow((double)aVar22.iVal,(double)aVar25.iVal);
          pcVar18 = (char *)(long)dVar23;
        }
      }
      else {
        if (LVar26.type == LIT_INT) {
          aVar22.dVal = (double)aVar22.iVal;
        }
        pIVar7 = (Instance *)((ulong)pIVar7 & 0xffffffff);
        if (LVar27.type == LIT_INT) {
          aVar25.dVal = (double)aVar25.iVal;
        }
        pcVar18 = (char *)0x0;
        switch(TVar2) {
        case TOKEN_MINUS:
          pcVar18 = (char *)(aVar22.dVal - aVar25.dVal);
          break;
        case TOKEN_PLUS:
          pcVar18 = (char *)(aVar22.dVal + aVar25.dVal);
          break;
        case TOKEN_SLASH:
          pcVar18 = (char *)(aVar22.dVal / aVar25.dVal);
          break;
        case TOKEN_STAR:
          pcVar18 = (char *)(aVar22.dVal * aVar25.dVal);
          break;
        case TOKEN_PERCEN:
          pcVar18 = 
          "\x1b[31m\n[Runtime Error] [Line:%d] %% can only be applied between two integers!\x1b[0m";
LAB_00105fca:
          printf(pcVar18,uVar17);
          stop();
          goto LAB_00105fd6;
        case TOKEN_CARET:
          pcVar18 = (char *)pow(aVar22.dVal,aVar25.dVal);
        }
      }
      __return_storage_ptr__->type = OBJECT_LITERAL;
      (__return_storage_ptr__->field_1).instance = pIVar7;
LAB_00105f0e:
      (__return_storage_ptr__->field_1).routine.name = pcVar18;
      return __return_storage_ptr__;
    }
    pcVar18 = 
    "\x1b[31m\n[Runtime Error] [Line:%d] Binary operation can only be done on numerical values!\x1b[0m"
    ;
    goto LAB_00105ff1;
  case EXPR_LOGICAL:
    uVar3 = (expression->field_1).binary.line;
    uVar17 = (ulong)uVar3;
    pEVar4 = (expression->field_1).binary.left;
    TVar2 = (expression->field_1).binary.op.type;
    expression_00 = (expression->field_1).binary.right;
    resolveExpression(&local_b0,pEVar4,env);
    resolveExpression(&local_70,expression_00,env);
    if ((local_b0.type ^ OBJECT_INSTANCE) == OBJECT_NULL &&
        (local_70.type ^ OBJECT_INSTANCE) == OBJECT_NULL) {
      pIVar7 = (Instance *)(uVar17 | 0x300000000);
      if (TVar2 == TOKEN_BANG_EQUAL) {
        bVar20 = (Instance *)CONCAT44(local_b0.field_1.literal.type,local_b0.field_1.literal.line)
                 != local_70.field_1.instance;
        OVar9 = OBJECT_LITERAL;
        bVar21 = false;
        goto LAB_00105ba0;
      }
      if (TVar2 == TOKEN_EQUAL_EQUAL) {
        bVar20 = (Instance *)CONCAT44(local_b0.field_1.literal.type,local_b0.field_1.literal.line)
                 == local_70.field_1.instance;
        OVar9 = OBJECT_LITERAL;
        bVar21 = false;
        goto LAB_00105ba0;
      }
LAB_00105fd6:
      pcVar18 = "\x1b[31m\n[Runtime Error] [Line:%d] Can\'t compare container instances!\x1b[0m";
      goto LAB_00105ff1;
    }
    if (((local_b0.type ^ OBJECT_INSTANCE) == OBJECT_NULL && local_70.type == OBJECT_LITERAL) ||
       (local_b0.type == OBJECT_LITERAL && (local_70.type ^ OBJECT_INSTANCE) == OBJECT_NULL)) {
      pOVar12 = &local_70;
      if (local_b0.type == OBJECT_LITERAL) {
        pOVar12 = &local_b0;
      }
      pOVar19 = &local_70;
      if (local_b0.type == OBJECT_INSTANCE) {
        pOVar19 = &local_b0;
      }
      if ((pOVar12->field_1).literal.type != LIT_NULL) {
        pcVar18 = 
        "\x1b[31m\n[Runtime Error] [Line:%d] Unable to compare between literal and instances!\x1b[0m"
        ;
        goto LAB_00105ff1;
      }
      pIVar7 = (Instance *)(uVar17 | 0x300000000);
      if (TVar2 == TOKEN_BANG_EQUAL) {
        bVar20 = (pOVar19->field_1).instance != (Instance *)0x0;
      }
      else {
        if (TVar2 != TOKEN_EQUAL_EQUAL) {
          pcVar18 = "\x1b[31m\n[Runtime Error] [Line:%d] Null can\'t be compared!\x1b[0m";
          goto LAB_00105ff1;
        }
        bVar20 = (pOVar19->field_1).instance == (Instance *)0x0;
      }
      OVar9 = OBJECT_LITERAL;
      bVar21 = false;
    }
    else {
      OVar9 = OBJECT_NULL;
      pIVar7 = (Instance *)0x400000000;
      bVar21 = true;
      bVar20 = false;
    }
LAB_00105ba0:
    if (!bVar21) {
      __return_storage_ptr__->type = OVar9;
      (__return_storage_ptr__->field_1).instance = pIVar7;
      *(ulong *)((long)&__return_storage_ptr__->field_1 + 8) = (ulong)bVar20;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
      (__return_storage_ptr__->field_1).routine.arguments = (char **)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
      return __return_storage_ptr__;
    }
    LVar26 = resolveLiteral(pEVar4,uVar3,env);
    aVar22 = LVar26.field_2;
    uVar11 = LVar26._0_8_;
    LVar27 = resolveLiteral(expression_00,uVar3,env);
    aVar25 = LVar27.field_2;
    uVar16 = uVar11 >> 0x20;
    uVar13 = LVar27._0_8_ >> 0x20;
    if ((uVar16 == 4) || (LVar10 = LVar27.type, LVar10 == LIT_NULL)) {
      if (TVar2 == TOKEN_BANG_EQUAL) {
        bVar21 = uVar13 != 4 || uVar16 != 4;
      }
      else if (TVar2 == TOKEN_EQUAL_EQUAL) {
        bVar21 = uVar16 == 4 && uVar13 == 4;
      }
      else {
        bVar21 = false;
        printf("\x1b[31m\n[Runtime Error] [Line:%d] Unable to compare Null!\x1b[0m",uVar17);
      }
      pcVar18 = (char *)(ulong)bVar21;
      __return_storage_ptr__->type = OBJECT_LITERAL;
      (__return_storage_ptr__->field_1).instance = (Instance *)(uVar17 | 0x300000000);
      goto LAB_00105f0e;
    }
    LVar14 = LVar26.type;
    if ((LVar14 == LIT_STRING) && (LVar10 == LIT_STRING)) {
      switch(TVar2) {
      case TOKEN_BANG_EQUAL:
        iVar5 = strcmp(aVar22.sVal,aVar25.sVal);
        bVar21 = iVar5 != 0;
        break;
      default:
        pcVar18 = 
        "\x1b[31m\n[Runtime Error] [Line:%d] Bad logical operator between string operands!\x1b[0m";
        goto LAB_00105fc8;
      case TOKEN_EQUAL_EQUAL:
        iVar5 = strcmp(aVar22.sVal,aVar25.sVal);
        bVar21 = iVar5 == 0;
        break;
      case TOKEN_GREATER:
        sVar8 = strlen(aVar22.sVal);
        sVar6 = strlen(aVar25.sVal);
        bVar21 = sVar6 < sVar8;
        break;
      case TOKEN_GREATER_EQUAL:
        sVar8 = strlen(aVar22.sVal);
        sVar6 = strlen(aVar25.sVal);
        bVar21 = sVar6 <= sVar8;
        break;
      case TOKEN_LESS:
        sVar8 = strlen(aVar22.sVal);
        sVar6 = strlen(aVar25.sVal);
        bVar21 = sVar8 < sVar6;
        break;
      case TOKEN_LESS_EQUAL:
        sVar8 = strlen(aVar22.sVal);
        sVar6 = strlen(aVar25.sVal);
        bVar21 = sVar8 <= sVar6;
      }
      pcVar18 = (char *)(ulong)bVar21;
      __return_storage_ptr__->type = OBJECT_LITERAL;
      (__return_storage_ptr__->field_1).instance = (Instance *)(uVar11 | 0x300000000);
      goto LAB_00105f0e;
    }
    if ((((LVar14 != LIT_LOGICAL) && (uVar16 != 0)) &&
        ((uVar11 & 0xffffffff00000000) != 0x100000000)) ||
       (((LVar10 != LIT_LOGICAL && (uVar13 != 0)) &&
        ((LVar27._0_8_ & 0xffffffff00000000) != 0x100000000)))) {
      pcVar18 = "\x1b[31m\n[Runtime Error] [Line:%d] Bad operand for logical operator!\x1b[0m";
LAB_00105fc8:
      uVar17 = (ulong)uVar3;
      goto LAB_00105fca;
    }
    aVar24.iVal = aVar22.iVal;
    if (LVar14 == LIT_INT) {
      aVar24.dVal = (double)aVar22.iVal;
    }
    if (LVar10 == LIT_INT) {
      aVar25.dVal = (double)aVar25.iVal;
    }
    switch(TVar2) {
    case TOKEN_BANG_EQUAL:
      bVar21 = ABS(aVar24.dVal - aVar25.dVal) == 1e-25;
      bVar20 = ABS(aVar24.dVal - aVar25.dVal) < 1e-25;
      goto LAB_00105f61;
    case TOKEN_COMMA:
    case TOKEN_DOT:
    case TOKEN_COLON:
    case TOKEN_EQUAL:
      break;
    case TOKEN_EQUAL_EQUAL:
      aVar24.dVal = ABS(aVar24.dVal - aVar25.dVal);
      aVar25.sVal = (char *)0x3abef2d0f5da7dd9;
    case TOKEN_LESS_EQUAL:
      bVar21 = aVar25.dVal < aVar24.dVal;
LAB_00105f54:
      aVar22.iVal._1_7_ = 0;
      aVar22.lVal._0_1_ = !bVar21;
      break;
    case TOKEN_GREATER:
      bVar21 = aVar24.dVal == aVar25.dVal;
      bVar20 = aVar24.dVal < aVar25.dVal;
      goto LAB_00105f61;
    case TOKEN_GREATER_EQUAL:
      bVar21 = aVar24.dVal < aVar25.dVal;
      goto LAB_00105f54;
    case TOKEN_LESS:
      bVar21 = aVar25.dVal == aVar24.dVal;
      bVar20 = aVar25.dVal < aVar24.dVal;
LAB_00105f61:
      aVar22.iVal._1_7_ = 0;
      aVar22.lVal._0_1_ = !bVar20 && !bVar21;
      break;
    default:
      if (TVar2 == TOKEN_AND) {
        if ((LVar14 != LIT_LOGICAL) || (LVar10 != LIT_LOGICAL)) {
          pcVar18 = 
          "\x1b[31m\n[Runtime Error] [Line:%d] \'And\' can only be applied over logical expressions!\x1b[0m"
          ;
          goto LAB_00105fc8;
        }
        aVar22._0_4_ = LVar26.field_2._0_4_ & LVar27.field_2._0_4_;
        aVar22.iVal._4_4_ = 0;
      }
      else if (TVar2 == TOKEN_OR) {
        if ((LVar14 != LIT_LOGICAL) || (LVar10 != LIT_LOGICAL)) {
          pcVar18 = 
          "\x1b[31m\n[Runtime Error] [Line:%d] \'Or\' can only be applied over logical expressions!\x1b[0m"
          ;
          goto LAB_00105fc8;
        }
        aVar22._0_4_ = LVar26.field_2._0_4_ | LVar27.field_2._0_4_;
        aVar22.iVal._4_4_ = 0;
      }
    }
    __return_storage_ptr__->type = OBJECT_LITERAL;
    (__return_storage_ptr__->field_1).instance = (Instance *)(uVar11 | 0x300000000);
    ((anon_union_8_4_50a03f35_for_Literal_2 *)((long)&__return_storage_ptr__->field_1 + 8))->dVal =
         (double)aVar22;
    break;
  case EXPR_LITERAL:
    pIVar7 = *(Instance **)&expression->field_1;
    aVar22 = (anon_union_8_4_50a03f35_for_Literal_2)(expression->field_1).binary.left;
    __return_storage_ptr__->type = OBJECT_LITERAL;
    (__return_storage_ptr__->field_1).instance = pIVar7;
    (__return_storage_ptr__->field_1).literal.field_2 = aVar22;
    break;
  case EXPR_VARIABLE:
    env_get(__return_storage_ptr__,(expression->field_1).variable.name,
            (expression->field_1).binary.line,env);
    break;
  case EXPR_ARRAY:
    uVar3 = (expression->field_1).binary.line;
    pcVar18 = (expression->field_1).arrayExpression.identifier;
    LVar26 = resolveLiteral((expression->field_1).binary.left,uVar3,env);
    if (LVar26.type == LIT_INT) {
      env_get(&local_b0,pcVar18,uVar3,env);
      if ((local_b0.type != OBJECT_LITERAL) || (local_b0.field_1.literal.type != LIT_STRING)) {
        env_arr_get(__return_storage_ptr__,pcVar18,uVar3,LVar26.field_2.iVal,env);
        return __return_storage_ptr__;
      }
      sVar8 = strlen(local_b0.field_1.routine.name);
      lVar15 = (long)LVar26.field_2._0_4_;
      if ((lVar15 < 1) || ((long)(sVar8 + 1) < lVar15)) {
        printf("\x1b[31m\n[Runtime Error] [Line:%d] String index out of range [%ld]!\x1b[0m",
               (ulong)uVar3);
        goto LAB_00105ff8;
      }
      if (lVar15 != sVar8 + 1) {
        cVar1 = *(char *)((long)local_b0.field_1.arr.values + lVar15 + -1);
        pcVar18 = (char *)malloc(2);
        *pcVar18 = cVar1;
        pcVar18[1] = '\0';
        __return_storage_ptr__->type = OBJECT_LITERAL;
        (__return_storage_ptr__->field_1).instance = (Instance *)0x200000000;
        goto LAB_00105f0e;
      }
      goto switchD_0010577b_caseD_7;
    }
    pcVar18 = "\x1b[31m\n[Runtime Error] [Line:%d] Array index must be an integer!\x1b[0m";
    goto LAB_00105ff1;
  case EXPR_CALL:
    resolveCall(__return_storage_ptr__,(expression->field_1).callExpression,env);
    break;
  case EXPR_REFERENCE:
    pEVar4 = (expression->field_1).referenceExpression.member;
    resolveExpression(&local_b0,(expression->field_1).binary.left,env);
    if (local_b0.type == OBJECT_INSTANCE) {
      resolveExpression(__return_storage_ptr__,pEVar4,
                        *(Environment **)
                         (CONCAT44(local_b0.field_1.literal.type,local_b0.field_1.literal.line) +
                         0x18));
      return __return_storage_ptr__;
    }
    pcVar18 = "\x1b[31m\n[Runtime Error] [Line:%d] Invalid member reference!\x1b[0m";
LAB_00105ff1:
    printf(pcVar18);
LAB_00105ff8:
    putchar(10);
    unload_all();
    exit(1);
  case EXPR_NONE:
switchD_0010577b_caseD_7:
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
    (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
    (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
    __return_storage_ptr__->type = OBJECT_NULL;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
    (__return_storage_ptr__->field_1).instance = (Instance *)0x400000000;
  }
  return __return_storage_ptr__;
}

Assistant:

static Object resolveExpression(Expression* expression, Environment *env){
    //   printf("\nSolving expression : %s", expressionNames[expression->type]);
    switch(expression->type){
        case EXPR_LITERAL:
            return fromLiteral(expression->literal);
        case EXPR_BINARY:
            return resolveBinary(expression->binary, env);
        case EXPR_LOGICAL:
            return resolveLogical(expression->logical, env);
        case EXPR_NONE:
            return nullObject;
        case EXPR_VARIABLE:
            return resolveVariable(expression->variable, env);
        case EXPR_ARRAY:
            return resolveArray(expression->arrayExpression, env);
        case EXPR_CALL:
            return resolveCall(expression->callExpression, env);
        case EXPR_REFERENCE:
            return resolveReference(expression->referenceExpression, env);
    }
}